

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

SQInteger __thiscall
SQClass::Next(SQClass *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQClassMember *pSVar1;
  SQInteger SVar2;
  undefined8 *puVar3;
  uint uVar4;
  ulong uVar5;
  SQObjectPtr oval;
  SQObjectPtr local_38;
  SQObject local_28;
  
  local_38.super_SQObject._type = OT_NULL;
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar2 = SQTable::Next(this->_members,false,refpos,outkey,&local_38);
  if (SVar2 != -1) {
    uVar4 = local_38.super_SQObject._unVal._0_4_ & 0xffffff;
    if ((local_38.super_SQObject._unVal._0_4_ >> 0x18 & 1) == 0) {
      pSVar1 = (this->_defaultvalues)._vals;
      uVar5 = (ulong)(uVar4 << 5);
      puVar3 = (undefined8 *)((long)&(pSVar1->val).super_SQObject._type + uVar5);
      if (*(int *)((long)&(pSVar1->val).super_SQObject._type + uVar5) == 0x8010000) {
        puVar3 = (undefined8 *)(puVar3[1] + 0x18);
      }
      local_28._0_8_ = *puVar3;
      local_28._unVal = *(SQObjectValue *)(puVar3 + 1);
      SQObjectPtr::operator=(outval,&local_28);
    }
    else {
      SQObjectPtr::operator=
                (outval,(SQObjectPtr *)
                        ((long)&(((this->_methods)._vals)->val).super_SQObject._type +
                        (ulong)(uVar4 << 5)));
    }
  }
  SQObjectPtr::~SQObjectPtr(&local_38);
  return SVar2;
}

Assistant:

SQInteger SQClass::Next(const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQObjectPtr oval;
    SQInteger idx = _members->Next(false,refpos,outkey,oval);
    if(idx != -1) {
        if(_ismethod(oval)) {
            outval = _methods[_member_idx(oval)].val;
        }
        else {
            SQObjectPtr &o = _defaultvalues[_member_idx(oval)].val;
            outval = _realval(o);
        }
    }
    return idx;
}